

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_queued.c
# Opt level: O0

void libpd_queued_receive_pd_messages(void)

{
  anon_enum_32 *paVar1;
  pd_params *p_00;
  int len;
  pd_params *ppVar2;
  pd_params *p;
  char *buffer;
  char *end;
  size_t available;
  queued_stuff *queued;
  
  available = (size_t)libpd_mainimp.i_queued;
  len = rb_available_to_read(*(ring_buffer **)((long)libpd_mainimp.i_queued + 0x70));
  end = (char *)(long)len;
  if (end != (char *)0x0) {
    rb_read_from_buffer(*(ring_buffer **)(available + 0x70),(char *)(available + 0x80),len);
    buffer = end + available + 0x80;
    p = (pd_params *)(available + 0x80);
    while (p_00 = p, p < buffer) {
      ppVar2 = p + 1;
      paVar1 = &p->type;
      p = ppVar2;
      switch(*paVar1) {
      case LIBPD_PRINT:
        receive_print(p_00,(char **)&p);
        break;
      case LIBPD_BANG:
        receive_bang(p_00,(char **)&p);
        break;
      case LIBPD_FLOAT:
        receive_float(p_00,(char **)&p);
        break;
      case LIBPD_SYMBOL:
        receive_symbol(p_00,(char **)&p);
        break;
      case LIBPD_LIST:
        receive_list(p_00,(char **)&p);
        break;
      case LIBPD_MESSAGE:
        receive_message(p_00,(char **)&p);
      }
    }
  }
  return;
}

Assistant:

void libpd_queued_receive_pd_messages() {
  queued_stuff *queued = QUEUEDSTUFF;
  size_t available = rb_available_to_read(queued->pd_receive_buffer);
  if (!available) return;
  rb_read_from_buffer(queued->pd_receive_buffer, queued->temp_buffer, (int)available);
  char *end = queued->temp_buffer + available;
  char *buffer = queued->temp_buffer;
  while (buffer < end) {
    pd_params *p = (pd_params *)buffer;
    buffer += S_PD_PARAMS;
    switch (p->type) {
      case LIBPD_PRINT: {
        receive_print(p, &buffer);
        break;
      }
      case LIBPD_BANG: {
        receive_bang(p, &buffer);
        break;
      }
      case LIBPD_FLOAT: {
        receive_float(p, &buffer);
        break;
      }
      case LIBPD_SYMBOL: {
        receive_symbol(p, &buffer);
        break;
      }
      case LIBPD_LIST: {
        receive_list(p, &buffer);
        break;
      }
      case LIBPD_MESSAGE: {
        receive_message(p, &buffer);
        break;
      }
      default:
        break;
    }
  }
}